

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDeepTiledOutputFile.cpp
# Opt level: O1

void __thiscall
Imf_3_2::anon_unknown_8::TileBufferTask::TileBufferTask
          (TileBufferTask *this,TaskGroup *group,Data *ofd,int number,int dx,int dy,int lx,int ly)

{
  pointer ppTVar1;
  TileBuffer *pTVar2;
  
  IlmThread_3_2::Task::Task(&this->super_Task,group);
  *(undefined ***)this = &PTR__TileBufferTask_003d7560;
  this->_ofd = ofd;
  ppTVar1 = (ofd->tileBuffers).
            super__Vector_base<Imf_3_2::(anonymous_namespace)::TileBuffer_*,_std::allocator<Imf_3_2::(anonymous_namespace)::TileBuffer_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  this->_tileBuffer =
       ppTVar1[(ulong)(long)number %
               (ulong)((long)(ofd->tileBuffers).
                             super__Vector_base<Imf_3_2::(anonymous_namespace)::TileBuffer_*,_std::allocator<Imf_3_2::(anonymous_namespace)::TileBuffer_*>_>
                             ._M_impl.super__Vector_impl_data._M_finish - (long)ppTVar1 >> 3)];
  IlmThread_3_2::Semaphore::wait();
  pTVar2 = this->_tileBuffer;
  *(int *)&(pTVar2->exception)._M_dataplus._M_p = dx;
  *(int *)((long)&(pTVar2->exception)._M_dataplus._M_p + 4) = dy;
  *(int *)&(pTVar2->exception)._M_string_length = lx;
  *(int *)((long)&(pTVar2->exception)._M_string_length + 4) = ly;
  return;
}

Assistant:

TileBufferTask::TileBufferTask (
    TaskGroup*                 group,
    DeepTiledOutputFile::Data* ofd,
    int                        number,
    int                        dx,
    int                        dy,
    int                        lx,
    int                        ly)
    : Task (group), _ofd (ofd), _tileBuffer (_ofd->getTileBuffer (number))
{
    //
    // Wait for the tileBuffer to become available
    //

    _tileBuffer->wait ();
    _tileBuffer->tileCoord = TileCoord (dx, dy, lx, ly);
}